

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::write_preamble
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,Header *header)

{
  int64_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  uint64_t header_size;
  
  lVar6 = std::ostream::tellp();
  if (lVar6 != 0) {
    __assert_fail("stream_.tellp() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                  ,0x100,
                  "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeAggregate>::write_preamble(const HeaderType &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeAggregate]"
                 );
  }
  std::ostream::write(&this->field_0x38,0x175f88);
  check_stream(this,"write magic bytes");
  write<unsigned_long>(this,&byte_order_mark);
  header_size = 0x38;
  write<unsigned_long>(this,&header_size);
  write<hta::storage::file::Metric::Header>(this,header);
  (this->data_begin_)._M_off = header_size + 0x18;
  (this->data_begin_)._M_state.__count = 0;
  (this->data_begin_)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  lVar6 = std::ostream::tellp();
  if (lVar6 == (this->data_begin_)._M_off) {
    flush(this);
    size(this);
    iVar1 = header->interval;
    uVar2 = (header->duration_period).num;
    uVar3 = (header->duration_period).den;
    iVar4 = header->interval_min;
    iVar5 = header->interval_factor;
    (this->header_).version = header->version;
    (this->header_).interval = iVar1;
    (this->header_).duration_period.num = uVar2;
    (this->header_).duration_period.den = uVar3;
    (this->header_).interval_min = iVar4;
    (this->header_).interval_factor = iVar5;
    (this->header_).interval_max = header->interval_max;
    return;
  }
  __assert_fail("stream_.tellp() == data_begin_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                ,0x108,
                "void hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeAggregate>::write_preamble(const HeaderType &) [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeAggregate]"
               );
}

Assistant:

void write_preamble(const HeaderType& header)
    {
        assert(stream_.tellp() == 0);
        stream_.write(magic_bytes.data(), magic_bytes.size());
        check_stream("write magic bytes");
        write(byte_order_mark);
        uint64_t header_size = sizeof(header);
        write(header_size);
        write(header);
        data_begin_ = header_begin_ + header_size;
        assert(stream_.tellp() == data_begin_);
        flush();
        size();
        header_ = header;
    }